

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O0

int Abc_EsopAddLits(int *pCover,word r0,word r1,word r2,word Max,int Var)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int c2;
  int c1;
  int c0;
  int i;
  int Var_local;
  word Max_local;
  word r2_local;
  word r1_local;
  word r0_local;
  int *pCover_local;
  
  if (Max == r0) {
    pCover_local._4_4_ = Abc_CostCubes(r2);
    if (pCover != (int *)0x0) {
      iVar2 = Abc_CostCubes(r0);
      iVar3 = Abc_CostCubes(r1);
      for (c1 = 0; c1 < iVar3; c1 = c1 + 1) {
        pCover[c1] = pCover[iVar2 + c1];
      }
      for (c1 = 0; c1 < pCover_local._4_4_; c1 = c1 + 1) {
        uVar1 = pCover[iVar2 + iVar3 + c1];
        iVar4 = Abc_Var2Lit(Var,0);
        pCover[iVar3 + c1] = uVar1 | 1 << ((byte)iVar4 & 0x1f);
      }
    }
  }
  else if (Max == r1) {
    pCover_local._4_4_ = Abc_CostCubes(r2);
    if (pCover != (int *)0x0) {
      iVar2 = Abc_CostCubes(r0);
      iVar3 = Abc_CostCubes(r1);
      for (c1 = 0; c1 < pCover_local._4_4_; c1 = c1 + 1) {
        uVar1 = pCover[iVar2 + iVar3 + c1];
        iVar4 = Abc_Var2Lit(Var,1);
        pCover[iVar2 + c1] = uVar1 | 1 << ((byte)iVar4 & 0x1f);
      }
    }
  }
  else {
    iVar2 = Abc_CostCubes(r0);
    iVar3 = Abc_CostCubes(r1);
    if (pCover != (int *)0x0) {
      Abc_CostCubes(r2);
      for (c1 = 0; c1 < iVar2; c1 = c1 + 1) {
        iVar4 = Abc_Var2Lit(Var,0);
        pCover[c1] = 1 << ((byte)iVar4 & 0x1f) | pCover[c1];
      }
      for (c1 = 0; c1 < iVar3; c1 = c1 + 1) {
        iVar4 = Abc_Var2Lit(Var,1);
        pCover[iVar2 + c1] = 1 << ((byte)iVar4 & 0x1f) | pCover[iVar2 + c1];
      }
    }
    pCover_local._4_4_ = iVar2 + iVar3;
  }
  return pCover_local._4_4_;
}

Assistant:

static inline int Abc_EsopAddLits( int * pCover, word r0, word r1, word r2, word Max, int Var )
{
    int i, c0, c1, c2;
    if ( Max == r0 )
    {
        c2 = Abc_CostCubes(r2);
        if ( pCover )
        {
            c0 = Abc_CostCubes(r0);
            c1 = Abc_CostCubes(r1);
            for ( i = 0; i < c1; i++ )
                pCover[i] = pCover[c0+i];
            for ( i = 0; i < c2; i++ )
                pCover[c1+i] = pCover[c0+c1+i] | (1 << Abc_Var2Lit(Var,0));
        }
        return c2;
    }
    else if ( Max == r1 )
    {
        c2 = Abc_CostCubes(r2);
        if ( pCover )
        {
            c0 = Abc_CostCubes(r0);
            c1 = Abc_CostCubes(r1);
            for ( i = 0; i < c2; i++ )
                pCover[c0+i] = pCover[c0+c1+i] | (1 << Abc_Var2Lit(Var,1));
        }
        return c2;
    }
    else
    {
        c0 = Abc_CostCubes(r0);
        c1 = Abc_CostCubes(r1);
        if ( pCover )
        {
            c2 = Abc_CostCubes(r2);
            for ( i = 0; i < c0; i++ )
                pCover[i] |= (1 << Abc_Var2Lit(Var,0));
            for ( i = 0; i < c1; i++ )
                pCover[c0+i] |= (1 << Abc_Var2Lit(Var,1));
        }
        return c0 + c1;
    }
}